

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0,true>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  byte *pbVar1;
  byte *pbVar2;
  double dVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  char cVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  int *piVar15;
  int *piVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int __tmp_12;
  int iVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  int *piVar27;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:294:15)>
  __cmp;
  bool bVar28;
  double dVar29;
  uchar offsets_l_storage [128];
  int *local_1d8;
  int *local_1d0;
  int local_1c4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  byte abStack_101 [128];
  byte local_81 [81];
  
  lVar11 = (long)end._M_current - (long)begin._M_current;
  uVar21 = lVar11 >> 2;
  local_1c4 = bad_allowed;
  local_1b0._M_current = begin._M_current;
  if ((long)uVar21 < 0x18) {
    if (!leftmost) {
LAB_00287ba2:
      if (begin._M_current == end._M_current) {
        return;
      }
      if (begin._M_current + 1 == end._M_current) {
        return;
      }
      pdVar8 = (comp.this)->vals;
      piVar12 = begin._M_current + 1;
      do {
        piVar16 = piVar12;
        iVar23 = begin._M_current[1];
        lVar11 = (long)*begin._M_current;
        dVar29 = pdVar8[iVar23];
        piVar12 = piVar16;
        if (pdVar8[lVar11] <= dVar29 && dVar29 != pdVar8[lVar11]) {
          do {
            piVar15 = piVar12;
            *piVar15 = (int)lVar11;
            lVar11 = (long)piVar15[-2];
            piVar12 = piVar15 + -1;
          } while (pdVar8[lVar11] <= dVar29 && dVar29 != pdVar8[lVar11]);
          piVar15[-1] = iVar23;
        }
        piVar12 = piVar16 + 1;
        begin._M_current = piVar16;
      } while (piVar16 + 1 != end._M_current);
      return;
    }
  }
  else {
    do {
      uVar9 = uVar21 >> 1;
      pdVar8 = (comp.this)->vals;
      if (uVar21 < 0x81) {
        uVar25 = (ulong)*local_1b0._M_current;
        uVar5 = local_1b0._M_current[uVar9];
        dVar29 = pdVar8[uVar25];
        dVar3 = pdVar8[(int)uVar5];
        if (dVar3 < dVar29) {
          local_1b0._M_current[uVar9] = *local_1b0._M_current;
          *local_1b0._M_current = uVar5;
          uVar25 = (ulong)uVar5;
          dVar29 = dVar3;
        }
        if (dVar29 < pdVar8[end._M_current[-1]]) {
          *local_1b0._M_current = end._M_current[-1];
          end._M_current[-1] = (int)uVar25;
          uVar25 = (ulong)(uint)*local_1b0._M_current;
        }
        uVar5 = local_1b0._M_current[uVar9];
        if (pdVar8[(int)uVar5] <= pdVar8[(int)uVar25] && pdVar8[(int)uVar25] != pdVar8[(int)uVar5])
        {
          local_1b0._M_current[uVar9] = (int)uVar25;
          *local_1b0._M_current = uVar5;
          uVar25 = (ulong)uVar5;
        }
      }
      else {
        iVar10 = local_1b0._M_current[uVar9];
        iVar23 = *local_1b0._M_current;
        dVar29 = pdVar8[iVar10];
        dVar3 = pdVar8[iVar23];
        if (dVar3 < dVar29) {
          *local_1b0._M_current = iVar10;
          local_1b0._M_current[uVar9] = iVar23;
          dVar29 = dVar3;
          iVar10 = iVar23;
        }
        if (dVar29 < pdVar8[end._M_current[-1]]) {
          local_1b0._M_current[uVar9] = end._M_current[-1];
          end._M_current[-1] = iVar10;
          iVar10 = local_1b0._M_current[uVar9];
        }
        iVar23 = *local_1b0._M_current;
        if (pdVar8[iVar23] <= pdVar8[iVar10] && pdVar8[iVar10] != pdVar8[iVar23]) {
          *local_1b0._M_current = iVar10;
          local_1b0._M_current[uVar9] = iVar23;
        }
        iVar10 = local_1b0._M_current[uVar9 - 1];
        iVar23 = local_1b0._M_current[1];
        dVar29 = pdVar8[iVar10];
        dVar3 = pdVar8[iVar23];
        if (dVar3 < dVar29) {
          local_1b0._M_current[1] = iVar10;
          local_1b0._M_current[uVar9 - 1] = iVar23;
          dVar29 = dVar3;
          iVar10 = iVar23;
        }
        if (dVar29 < pdVar8[end._M_current[-2]]) {
          local_1b0._M_current[uVar9 - 1] = end._M_current[-2];
          end._M_current[-2] = iVar10;
          iVar10 = local_1b0._M_current[uVar9 - 1];
        }
        iVar23 = local_1b0._M_current[1];
        if (pdVar8[iVar23] <= pdVar8[iVar10] && pdVar8[iVar10] != pdVar8[iVar23]) {
          local_1b0._M_current[1] = iVar10;
          local_1b0._M_current[uVar9 - 1] = iVar23;
        }
        iVar10 = local_1b0._M_current[uVar9 + 1];
        iVar23 = local_1b0._M_current[2];
        dVar29 = pdVar8[iVar10];
        dVar3 = pdVar8[iVar23];
        if (dVar3 < dVar29) {
          local_1b0._M_current[2] = iVar10;
          local_1b0._M_current[uVar9 + 1] = iVar23;
          dVar29 = dVar3;
          iVar10 = iVar23;
        }
        if (dVar29 < pdVar8[end._M_current[-3]]) {
          local_1b0._M_current[uVar9 + 1] = end._M_current[-3];
          end._M_current[-3] = iVar10;
          iVar10 = local_1b0._M_current[uVar9 + 1];
        }
        iVar23 = local_1b0._M_current[2];
        if (pdVar8[iVar23] <= pdVar8[iVar10] && pdVar8[iVar10] != pdVar8[iVar23]) {
          local_1b0._M_current[2] = iVar10;
          local_1b0._M_current[uVar9 + 1] = iVar23;
          iVar10 = iVar23;
        }
        iVar23 = local_1b0._M_current[uVar9];
        iVar6 = local_1b0._M_current[uVar9 - 1];
        dVar29 = pdVar8[iVar23];
        dVar3 = pdVar8[iVar6];
        iVar17 = iVar6;
        if (dVar3 < dVar29) {
          local_1b0._M_current[uVar9 - 1] = iVar23;
          local_1b0._M_current[uVar9] = iVar6;
          dVar29 = dVar3;
          iVar17 = iVar23;
          iVar23 = iVar6;
        }
        lVar18 = (long)iVar10;
        if (pdVar8[lVar18] <= dVar29) {
          lVar18 = (long)iVar23;
        }
        else {
          local_1b0._M_current[uVar9] = iVar10;
          local_1b0._M_current[uVar9 + 1] = iVar23;
          iVar23 = iVar10;
        }
        if (pdVar8[iVar17] <= pdVar8[lVar18] && pdVar8[lVar18] != pdVar8[iVar17]) {
          local_1b0._M_current[uVar9 - 1] = iVar23;
          local_1b0._M_current[uVar9] = iVar17;
          iVar23 = iVar17;
        }
        iVar10 = *local_1b0._M_current;
        *local_1b0._M_current = iVar23;
        local_1b0._M_current[uVar9] = iVar10;
        uVar25 = (ulong)(uint)*local_1b0._M_current;
      }
      iVar23 = (int)uVar25;
      if ((leftmost & 1U) == 0) {
        dVar29 = pdVar8[iVar23];
        if (dVar29 < pdVar8[local_1b0._M_current[-1]]) goto LAB_002871cf;
        lVar11 = 0;
        do {
          lVar18 = (long)*(end._M_current + lVar11 + -4);
          lVar11 = lVar11 + -4;
        } while (pdVar8[lVar18] <= dVar29 && dVar29 != pdVar8[lVar18]);
        piVar12 = end._M_current + lVar11;
        _Var14._M_current = local_1b0._M_current;
        if (lVar11 == -4) {
          uVar25 = uVar25 & 0xffffffff;
          do {
            if (piVar12 <= _Var14._M_current) break;
            _Var14._M_current = _Var14._M_current + 1;
            uVar25 = (ulong)*_Var14._M_current;
          } while (dVar29 < pdVar8[uVar25] || dVar29 == pdVar8[uVar25]);
        }
        else {
          do {
            uVar25 = (ulong)_Var14._M_current[1];
            _Var14._M_current = _Var14._M_current + 1;
          } while (dVar29 < pdVar8[uVar25] || dVar29 == pdVar8[uVar25]);
        }
        while (_Var14._M_current < piVar12) {
          *_Var14._M_current = (int)lVar18;
          *piVar12 = (int)uVar25;
          do {
            lVar18 = (long)piVar12[-1];
            piVar12 = piVar12 + -1;
          } while (pdVar8[lVar18] <= dVar29 && dVar29 != pdVar8[lVar18]);
          do {
            uVar25 = (ulong)_Var14._M_current[1];
            _Var14._M_current = _Var14._M_current + 1;
          } while (dVar29 < pdVar8[uVar25] || dVar29 == pdVar8[uVar25]);
        }
        *local_1b0._M_current = (int)lVar18;
        *piVar12 = iVar23;
        begin._M_current = piVar12 + 1;
        lVar18 = (long)end._M_current - (long)begin._M_current;
        uVar21 = lVar18 >> 2;
      }
      else {
        dVar29 = pdVar8[iVar23];
LAB_002871cf:
        lVar18 = 0;
        do {
          iVar10 = *(local_1b0._M_current + lVar18 + 4);
          lVar18 = lVar18 + 4;
        } while (dVar29 < pdVar8[iVar10]);
        piVar12 = lVar18 + local_1b0._M_current;
        _Var14._M_current = end._M_current;
        if (lVar18 == 4) {
          do {
            if (_Var14._M_current <= piVar12) break;
            piVar16 = _Var14._M_current + -1;
            _Var14._M_current = _Var14._M_current + -1;
          } while (pdVar8[*piVar16] <= dVar29);
        }
        else {
          do {
            piVar16 = _Var14._M_current + -1;
            _Var14._M_current = _Var14._M_current + -1;
          } while (pdVar8[*piVar16] <= dVar29);
        }
        begin._M_current = piVar12;
        if (piVar12 < _Var14._M_current) {
          begin._M_current = lVar18 + local_1b0._M_current + 1;
          *(lVar18 + local_1b0._M_current) = *_Var14._M_current;
          *_Var14._M_current = iVar10;
          if (begin._M_current < _Var14._M_current) {
            lVar20 = 0;
            uVar9 = 0;
            uVar25 = 0;
            lVar18 = 0;
            piVar16 = _Var14._M_current;
            local_1d8 = begin._M_current;
            local_1d0 = _Var14._M_current;
            do {
              lVar24 = lVar18;
              uVar19 = uVar25;
              uVar13 = uVar9;
              uVar25 = (long)piVar16 - (long)begin._M_current >> 2;
              uVar9 = uVar25 >> (uVar19 == 0);
              if (uVar13 != 0) {
                uVar9 = 0;
              }
              uVar25 = uVar25 - uVar9;
              if (uVar19 != 0) {
                uVar25 = 0;
              }
              if (uVar9 < 0x40) {
                if (uVar9 != 0) {
                  uVar22 = 0;
                  do {
                    local_81[uVar13 + 1] = (byte)uVar22;
                    pdVar8 = (comp.this)->vals;
                    uVar22 = uVar22 + 1;
                    uVar13 = uVar13 + (pdVar8[*begin._M_current] < pdVar8[iVar23] ||
                                      pdVar8[*begin._M_current] == pdVar8[iVar23]);
                    begin._M_current = begin._M_current + 1;
                  } while (uVar9 != uVar22);
                }
              }
              else {
                piVar15 = begin._M_current;
                uVar9 = 0xfffffffffffffff8;
                do {
                  piVar27 = piVar15;
                  uVar22 = uVar9 + 8;
                  local_81[uVar13 + 1] = (byte)uVar22;
                  dVar29 = (comp.this)->vals[begin._M_current[uVar9 + 8]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (dVar29 < *pdVar8 || dVar29 == *pdVar8) + uVar13;
                  cVar7 = (char)uVar9;
                  local_81[lVar18 + 1] = cVar7 + 9;
                  dVar29 = (comp.this)->vals[begin._M_current[uVar9 + 9]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(dVar29 < *pdVar8 || dVar29 == *pdVar8) + lVar18;
                  local_81[lVar18 + 1] = cVar7 + 10;
                  dVar29 = (comp.this)->vals[begin._M_current[uVar9 + 10]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(dVar29 < *pdVar8 || dVar29 == *pdVar8) + lVar18;
                  local_81[lVar18 + 1] = cVar7 + 0xb;
                  dVar29 = (comp.this)->vals[begin._M_current[uVar9 + 0xb]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(dVar29 < *pdVar8 || dVar29 == *pdVar8) + lVar18;
                  local_81[lVar18 + 1] = cVar7 + 0xc;
                  dVar29 = (comp.this)->vals[begin._M_current[uVar9 + 0xc]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(dVar29 < *pdVar8 || dVar29 == *pdVar8) + lVar18;
                  local_81[lVar18 + 1] = cVar7 + 0xd;
                  dVar29 = (comp.this)->vals[begin._M_current[uVar9 + 0xd]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(dVar29 < *pdVar8 || dVar29 == *pdVar8) + lVar18;
                  local_81[lVar18 + 1] = cVar7 + 0xe;
                  dVar29 = (comp.this)->vals[begin._M_current[uVar9 + 0xe]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(dVar29 < *pdVar8 || dVar29 == *pdVar8) + lVar18;
                  local_81[lVar18 + 1] = cVar7 + 0xf;
                  pdVar8 = (comp.this)->vals;
                  uVar13 = (ulong)(pdVar8[begin._M_current[uVar9 + 0xf]] < pdVar8[iVar23] ||
                                  pdVar8[begin._M_current[uVar9 + 0xf]] == pdVar8[iVar23]) + lVar18;
                  piVar15 = begin._M_current + uVar9 + 0x10;
                  uVar9 = uVar22;
                } while (uVar22 < 0x38);
                begin._M_current = piVar27 + 8;
              }
              if (uVar25 < 0x40) {
                if (uVar25 != 0) {
                  uVar9 = 0;
                  do {
                    uVar9 = uVar9 + 1;
                    abStack_101[uVar19 + 1] = (byte)uVar9;
                    piVar15 = piVar16 + -1;
                    piVar16 = piVar16 + -1;
                    pdVar8 = (comp.this)->vals;
                    uVar19 = uVar19 + (pdVar8[iVar23] <= pdVar8[*piVar15] &&
                                      pdVar8[*piVar15] != pdVar8[iVar23]);
                  } while (uVar25 != uVar9);
                }
              }
              else {
                uVar9 = 0xfffffffffffffff8;
                do {
                  cVar7 = (char)uVar9;
                  abStack_101[uVar19 + 1] = cVar7 + 9;
                  dVar29 = (comp.this)->vals[piVar16[-1]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (*pdVar8 <= dVar29 && dVar29 != *pdVar8) + uVar19;
                  abStack_101[lVar18 + 1] = cVar7 + 10;
                  dVar29 = (comp.this)->vals[piVar16[-2]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(*pdVar8 <= dVar29 && dVar29 != *pdVar8) + lVar18;
                  abStack_101[lVar18 + 1] = cVar7 + 0xb;
                  dVar29 = (comp.this)->vals[piVar16[-3]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(*pdVar8 <= dVar29 && dVar29 != *pdVar8) + lVar18;
                  abStack_101[lVar18 + 1] = cVar7 + 0xc;
                  dVar29 = (comp.this)->vals[piVar16[-4]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(*pdVar8 <= dVar29 && dVar29 != *pdVar8) + lVar18;
                  abStack_101[lVar18 + 1] = cVar7 + 0xd;
                  dVar29 = (comp.this)->vals[piVar16[-5]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(*pdVar8 <= dVar29 && dVar29 != *pdVar8) + lVar18;
                  abStack_101[lVar18 + 1] = cVar7 + 0xe;
                  dVar29 = (comp.this)->vals[piVar16[-6]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(*pdVar8 <= dVar29 && dVar29 != *pdVar8) + lVar18;
                  abStack_101[lVar18 + 1] = cVar7 + 0xf;
                  dVar29 = (comp.this)->vals[piVar16[-7]];
                  pdVar8 = (comp.this)->vals + iVar23;
                  lVar18 = (ulong)(*pdVar8 <= dVar29 && dVar29 != *pdVar8) + lVar18;
                  abStack_101[lVar18 + 1] = cVar7 + 0x10;
                  piVar15 = piVar16 + -8;
                  piVar16 = piVar16 + -8;
                  pdVar8 = (comp.this)->vals;
                  uVar19 = (ulong)(pdVar8[iVar23] <= pdVar8[*piVar15] &&
                                  pdVar8[*piVar15] != pdVar8[iVar23]) + lVar18;
                  uVar9 = uVar9 + 8;
                } while (uVar9 < 0x38);
              }
              uVar22 = uVar13;
              if (uVar19 < uVar13) {
                uVar22 = uVar19;
              }
              pbVar2 = local_81 + lVar20 + 1;
              pbVar1 = abStack_101 + lVar24 + 1;
              if (uVar13 == uVar19) {
                if (uVar22 != 0) {
                  uVar9 = 0;
                  do {
                    bVar4 = pbVar1[uVar9];
                    iVar10 = local_1d8[pbVar2[uVar9]];
                    local_1d8[pbVar2[uVar9]] = local_1d0[-(ulong)bVar4];
                    local_1d0[-(ulong)bVar4] = iVar10;
                    uVar9 = uVar9 + 1;
                  } while (uVar22 != uVar9);
                }
              }
              else if (uVar22 != 0) {
                piVar15 = local_1d0 + -(ulong)*pbVar1;
                iVar10 = local_1d8[*pbVar2];
                local_1d8[*pbVar2] = *piVar15;
                if (uVar22 != 1) {
                  uVar9 = 1;
                  do {
                    bVar4 = pbVar2[uVar9];
                    *piVar15 = local_1d8[bVar4];
                    piVar15 = local_1d0 + -(ulong)pbVar1[uVar9];
                    local_1d8[bVar4] = *piVar15;
                    uVar9 = uVar9 + 1;
                  } while (uVar22 != uVar9);
                }
                *piVar15 = iVar10;
              }
              uVar9 = uVar13 - uVar22;
              lVar20 = lVar20 + uVar22;
              if (uVar13 <= uVar19) {
                lVar20 = 0;
                local_1d8 = begin._M_current;
              }
              uVar25 = uVar19 - uVar22;
              if (uVar25 == 0) {
                local_1d0 = piVar16;
              }
              lVar18 = uVar22 + lVar24;
              if (uVar25 == 0) {
                lVar18 = 0;
              }
            } while (begin._M_current < piVar16);
            for (; uVar9 != 0; uVar9 = uVar9 - 1) {
              begin._M_current = piVar16 + -1;
              iVar10 = local_1d8[local_81[uVar9 + lVar20]];
              local_1d8[local_81[uVar9 + lVar20]] = piVar16[-1];
              piVar16[-1] = iVar10;
              piVar16 = begin._M_current;
            }
            if (uVar25 != 0) {
              if (uVar19 <= uVar13) {
                uVar13 = uVar19;
              }
              do {
                iVar10 = local_1d0[-(ulong)abStack_101[uVar19 + lVar24]];
                local_1d0[-(ulong)abStack_101[uVar19 + lVar24]] = *begin._M_current;
                *begin._M_current = iVar10;
                begin._M_current = begin._M_current + 1;
                uVar19 = uVar19 - 1;
              } while (uVar13 != uVar19);
            }
          }
        }
        end_00._M_current = begin._M_current + -1;
        *local_1b0._M_current = begin._M_current[-1];
        begin._M_current[-1] = iVar23;
        uVar9 = (long)end_00._M_current - (long)local_1b0._M_current >> 2;
        lVar18 = (long)end._M_current - (long)begin._M_current;
        uVar25 = lVar18 >> 2;
        if (((long)uVar9 < (long)(uVar21 >> 3)) || ((long)uVar25 < (long)(uVar21 >> 3))) {
          local_1c4 = local_1c4 + -1;
          if (local_1c4 == 0) {
            uVar9 = uVar21 - 2 >> 1;
            do {
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::separateLiftedMixedIntegerCover()::__0>>
                        (local_1b0,uVar9,uVar21,local_1b0._M_current[uVar9],
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:294:15)>
                          )comp.this);
              bVar28 = uVar9 != 0;
              uVar9 = uVar9 - 1;
            } while (bVar28);
            if (lVar11 < 5) {
              return;
            }
            lVar11 = (long)end._M_current - (long)local_1b0._M_current;
            do {
              end._M_current = end._M_current + -1;
              iVar23 = *end._M_current;
              *end._M_current = *local_1b0._M_current;
              lVar11 = lVar11 + -4;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::separateLiftedMixedIntegerCover()::__0>>
                        (local_1b0,0,lVar11 >> 2,iVar23,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:294:15)>
                          )comp.this);
            } while (4 < lVar11);
            return;
          }
          if (0x17 < (long)uVar9) {
            iVar23 = *local_1b0._M_current;
            uVar21 = uVar9 & 0xfffffffffffffffc;
            *local_1b0._M_current = *(local_1b0._M_current + uVar21);
            *(local_1b0._M_current + uVar21) = iVar23;
            iVar23 = begin._M_current[-2];
            begin._M_current[-2] = *(begin._M_current + (-4 - uVar21));
            *(begin._M_current + (-4 - uVar21)) = iVar23;
            if (0x80 < uVar9) {
              uVar9 = uVar9 >> 2;
              iVar23 = local_1b0._M_current[1];
              local_1b0._M_current[1] = local_1b0._M_current[uVar9 + 1];
              local_1b0._M_current[uVar9 + 1] = iVar23;
              iVar23 = local_1b0._M_current[2];
              local_1b0._M_current[2] = local_1b0._M_current[uVar9 + 2];
              local_1b0._M_current[uVar9 + 2] = iVar23;
              iVar23 = begin._M_current[-3];
              begin._M_current[-3] = begin._M_current[~uVar9 - 1];
              begin._M_current[~uVar9 - 1] = iVar23;
              iVar23 = begin._M_current[-4];
              begin._M_current[-4] = begin._M_current[-uVar9 + -3];
              begin._M_current[-uVar9 + -3] = iVar23;
            }
          }
          if (0x17 < (long)uVar25) {
            uVar21 = uVar25 & 0xfffffffffffffffc;
            iVar23 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar21);
            *(begin._M_current + uVar21) = iVar23;
            iVar23 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar21);
            *(end._M_current - uVar21) = iVar23;
            if (0x80 < uVar25) {
              uVar21 = uVar25 >> 2;
              iVar23 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar21 + 1];
              begin._M_current[uVar21 + 1] = iVar23;
              iVar23 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar21 + 2];
              begin._M_current[uVar21 + 2] = iVar23;
              iVar23 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar21];
              end._M_current[~uVar21] = iVar23;
              iVar23 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar21];
              end._M_current[-2 - uVar21] = iVar23;
            }
          }
        }
        else if (_Var14._M_current <= piVar12) {
          if (local_1b0._M_current + 1 != end_00._M_current &&
              local_1b0._M_current != end_00._M_current) {
            lVar11 = 4;
            uVar21 = 0;
            _Var14._M_current = local_1b0._M_current;
            piVar12 = local_1b0._M_current + 1;
            do {
              iVar23 = _Var14._M_current[1];
              lVar24 = (long)*_Var14._M_current;
              dVar29 = pdVar8[iVar23];
              lVar20 = lVar11;
              if (pdVar8[lVar24] <= dVar29 && dVar29 != pdVar8[lVar24]) {
                do {
                  *(int *)((long)local_1b0._M_current + lVar20) = (int)lVar24;
                  _Var14._M_current = local_1b0._M_current;
                  if (lVar20 == 4) goto LAB_00287956;
                  lVar24 = (long)*(local_1b0._M_current + lVar20 + -8);
                  lVar20 = lVar20 + -4;
                } while (pdVar8[lVar24] <= dVar29 && dVar29 != pdVar8[lVar24]);
                _Var14._M_current = lVar20 + local_1b0._M_current;
LAB_00287956:
                *_Var14._M_current = iVar23;
                uVar21 = uVar21 + ((long)piVar12 - (long)_Var14._M_current >> 2);
                if (8 < uVar21) goto LAB_00287b60;
              }
              piVar16 = piVar12 + 1;
              lVar11 = lVar11 + 4;
              _Var14._M_current = piVar12;
              piVar12 = piVar16;
            } while (piVar16 != end_00._M_current);
          }
          if (begin._M_current == end._M_current) {
            return;
          }
          piVar12 = begin._M_current + 1;
          if (piVar12 == end._M_current) {
            return;
          }
          lVar11 = 0;
          uVar21 = 0;
          piVar16 = begin._M_current;
          piVar15 = piVar12;
          do {
            lVar24 = (long)*piVar16;
            iVar23 = *piVar15;
            dVar29 = pdVar8[iVar23];
            lVar20 = lVar11;
            if (pdVar8[lVar24] <= dVar29 && dVar29 != pdVar8[lVar24]) {
              do {
                lVar26 = lVar20;
                *(int *)((long)begin._M_current + lVar26 + 4) = (int)lVar24;
                piVar16 = begin._M_current;
                piVar27 = begin._M_current;
                if (lVar26 == 0) goto LAB_002879e4;
                lVar24 = (long)*(begin._M_current + lVar26 + -4);
                lVar20 = lVar26 + -4;
              } while (pdVar8[lVar24] <= dVar29 && dVar29 != pdVar8[lVar24]);
              piVar16 = begin._M_current + lVar26;
              piVar27 = (int *)(lVar26 + -4 + (long)piVar12);
LAB_002879e4:
              *piVar27 = iVar23;
              uVar21 = uVar21 + ((long)piVar15 - (long)piVar16 >> 2);
              if (8 < uVar21) break;
            }
            piVar27 = piVar15 + 1;
            lVar11 = lVar11 + 4;
            piVar16 = piVar15;
            piVar15 = piVar27;
            if (piVar27 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_00287b60:
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::separateLiftedMixedIntegerCover()::__0,true>
                  (local_1b0,end_00,comp,local_1c4,(bool)(leftmost & 1));
        leftmost = false;
        uVar21 = uVar25;
      }
      lVar11 = lVar18;
      local_1b0._M_current = begin._M_current;
    } while (0x17 < (long)uVar21);
    if ((leftmost & 1U) == 0) goto LAB_00287ba2;
  }
  if ((begin._M_current != end._M_current) && (begin._M_current + 1 != end._M_current)) {
    pdVar8 = (comp.this)->vals;
    lVar11 = 4;
    piVar12 = begin._M_current;
    piVar16 = begin._M_current + 1;
    do {
      iVar23 = piVar12[1];
      lVar20 = (long)*piVar12;
      dVar29 = pdVar8[iVar23];
      lVar18 = lVar11;
      if (pdVar8[lVar20] <= dVar29 && dVar29 != pdVar8[lVar20]) {
        do {
          *(int *)((long)begin._M_current + lVar18) = (int)lVar20;
          piVar12 = begin._M_current;
          if (lVar18 == 4) goto LAB_00286f06;
          lVar20 = (long)*(begin._M_current + lVar18 + -8);
          lVar18 = lVar18 + -4;
        } while (pdVar8[lVar20] <= dVar29 && dVar29 != pdVar8[lVar20]);
        piVar12 = lVar18 + begin._M_current;
LAB_00286f06:
        *piVar12 = iVar23;
      }
      piVar15 = piVar16 + 1;
      lVar11 = lVar11 + 4;
      piVar12 = piVar16;
      piVar16 = piVar15;
    } while (piVar15 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }